

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  size_t amount;
  ushort uVar1;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar2;
  Reader *reader;
  ushort uVar3;
  size_t sVar4;
  word *pwVar5;
  ArrayPtr<capnp::word> AVar6;
  MessageSizeCounts MVar7;
  ArrayPtr<capnp::word> uncheckedBuffer;
  StructReader local_58;
  
  if ((0x6f < node._reader.dataSize) && (*(short *)((long)node._reader.data + 0xc) == 1)) {
    local_58.segment = *node._reader.data;
    MVar2 = kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long>
                      (&this->structSizeRequirements,(unsigned_long *)&local_58);
    if (MVar2.ptr != (RequiredSize *)0x0) {
      if (node._reader.dataSize < 0x80) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)((long)node._reader.data + 0xe);
      }
      if (uVar3 < (MVar2.ptr)->dataWordCount) {
        uVar1 = (MVar2.ptr)->pointerCount;
      }
      else {
        if (node._reader.dataSize < 0xd0) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)((long)node._reader.data + 0x18);
        }
        uVar1 = (MVar2.ptr)->pointerCount;
        if (uVar1 <= uVar3) goto LAB_003e8d40;
      }
      AVar6 = rewriteStructNodeWithSizes(this,node,(uint)(MVar2.ptr)->dataWordCount,(uint)uVar1);
      return AVar6;
    }
  }
LAB_003e8d40:
  local_58._32_8_ = node._reader._32_8_;
  local_58.nestingLimit = node._reader.nestingLimit;
  local_58._44_4_ = node._reader._44_4_;
  local_58.data = node._reader.data;
  local_58.pointers = node._reader.pointers;
  local_58.segment = node._reader.segment;
  local_58.capTable = node._reader.capTable;
  MVar7 = capnp::_::StructReader::totalSize(&local_58);
  amount = MVar7.wordCount * 8 + 8;
  pwVar5 = (word *)(MVar7.wordCount + 1);
  sVar4 = 0;
  reader = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  AVar6.size_ = (size_t)pwVar5;
  AVar6.ptr = (word *)reader;
  memset(reader,0,amount);
  uncheckedBuffer.size_ = sVar4;
  uncheckedBuffer.ptr = pwVar5;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&local_58,reader,uncheckedBuffer);
  return AVar6;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_MAYBE(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement->dataWordCount ||
          structNode.getPointerCount() < requirement->pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement->dataWordCount,
                                          requirement->pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}